

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNotationImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNotationImpl::setPublicId(DOMNotationImpl *this,XMLCh *arg)

{
  bool bVar1;
  int iVar2;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar3;
  long *local_80;
  MemoryManager *local_70;
  DOMDocumentImpl *local_60;
  long local_50;
  MemoryManager *local_40;
  XMLCh *arg_local;
  DOMNotationImpl *this_local;
  
  bVar1 = DOMNodeImpl::isReadOnly(&this->fNode);
  if (!bVar1) {
    iVar2 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      local_80 = (long *)0x0;
    }
    else {
      local_80 = (long *)(CONCAT44(extraout_var_01,iVar2) + -8);
    }
    pXVar3 = (XMLCh *)(**(code **)(*local_80 + 0x38))(local_80,arg);
    this->fPublicId = pXVar3;
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMNotationImpl *)0x0) {
    local_40 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar2 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      local_50 = 0;
    }
    else {
      local_50 = CONCAT44(extraout_var,iVar2) + -8;
    }
    if (local_50 == 0) {
      local_70 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        local_60 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_60 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
      }
      local_70 = DOMDocumentImpl::getMemoryManager(local_60);
    }
    local_40 = local_70;
  }
  DOMException::DOMException(this_00,7,0,local_40);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNotationImpl::setPublicId(const XMLCh *arg)
{
    if(fNode.isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR,0, GetDOMNodeMemoryManager);

    fPublicId = ((DOMDocumentImpl *)getOwnerDocument())->cloneString(arg);
}